

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_PlaneEquation * __thiscall
ON_PlaneEquation::UnitizedPlaneEquation
          (ON_PlaneEquation *__return_storage_ptr__,ON_PlaneEquation *this)

{
  bool bVar1;
  double dVar2;
  undefined1 local_50 [8];
  ON_3dVector v;
  ON_PlaneEquation tmp;
  double dd;
  ON_PlaneEquation *this_local;
  
  bVar1 = IsSet(this);
  if (bVar1) {
    dVar2 = DirectionLength(this);
    tmp.d._6_2_ = (ushort)((ulong)dVar2 >> 0x30);
    if ((tmp.d._6_2_ & 0x7ff0) != 0x7ff0) {
      if (2.2250738585072014e-308 < dVar2) {
        ON_PlaneEquation(__return_storage_ptr__,this->x / dVar2,this->y / dVar2,this->z / dVar2,
                         this->d / dVar2);
        return __return_storage_ptr__;
      }
      if (0.0 < dVar2) {
        ON_PlaneEquation((ON_PlaneEquation *)&v.z,this->x * 8.98846567431158e+307,
                         this->y * 8.98846567431158e+307,this->z * 8.98846567431158e+307,
                         this->d * 8.98846567431158e+307);
        dVar2 = DirectionLength((ON_PlaneEquation *)&v.z);
        tmp.d._6_2_ = (ushort)((ulong)dVar2 >> 0x30);
        if (((tmp.d._6_2_ & 0x7ff0) != 0x7ff0) && (2.2250738585072014e-308 < dVar2)) {
          ON_PlaneEquation(__return_storage_ptr__,v.z / dVar2,tmp.x / dVar2,tmp.y / dVar2,
                           tmp.z / dVar2);
          return __return_storage_ptr__;
        }
      }
    }
  }
  else if ((this->d == -1.23432101234321e+308) && (!NAN(this->d))) {
    Direction((ON_3dVector *)local_50,this);
    bVar1 = ON_3dVector::IsValid((ON_3dVector *)local_50);
    if ((bVar1) && (bVar1 = ON_3dVector::Unitize((ON_3dVector *)local_50), bVar1)) {
      ON_PlaneEquation(__return_storage_ptr__,(double)local_50,v.x,v.y,-1.23432101234321e+308);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->x = ZeroPlaneEquation.x;
  __return_storage_ptr__->y = ZeroPlaneEquation.y;
  __return_storage_ptr__->z = ZeroPlaneEquation.z;
  __return_storage_ptr__->d = ZeroPlaneEquation.d;
  return __return_storage_ptr__;
}

Assistant:

ON_PlaneEquation ON_PlaneEquation::UnitizedPlaneEquation() const
{
  if (IsSet())
  {
    // 15 September 2003 Dale Lear
    //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_3dVector::Length()
    //     for details.
    double dd = DirectionLength();

    if (ON_IS_FINITE(dd))
    {
      if (dd > ON_DBL_MIN)
      {
        return ON_PlaneEquation(x / dd, y / dd, z / dd, d / dd);
      }

      if (dd > 0.0)
      {
        // This code is rarely used and can be slow.
        // It multiplies by 2^1023 in an attempt to 
        // normalize the coordinates.
        // If the renormalization works, then we're
        // ok.  If the renormalization fails, we
        // return false.
        ON_PlaneEquation tmp(
          x*8.9884656743115795386465259539451e+307,
          y*8.9884656743115795386465259539451e+307,
          z*8.9884656743115795386465259539451e+307,
          d*8.9884656743115795386465259539451e+307
          );
        dd = tmp.DirectionLength();
        if (ON_IS_FINITE(dd) && dd > ON_DBL_MIN)
        {
          return ON_PlaneEquation(tmp.x / dd, tmp.y / dd, tmp.z / dd, tmp.d / dd);
        }
      }
    }
  }
  else if ( d == ON_UNSET_VALUE )
  {
    ON_3dVector v = Direction();
    if (v.IsValid() && v.Unitize())
    {
      return ON_PlaneEquation(v.x, v.y, v.z, ON_UNSET_VALUE);
    }
  }

  return ON_PlaneEquation::ZeroPlaneEquation;
}